

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O2

void __thiscall Battle::showStats(Battle *this,Player *player)

{
  ostream *poVar1;
  string local_30;
  
  UI::clearScreen();
  Player::getName_abi_cxx11_(&local_30,player);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_30);
  poVar1 = std::operator<<(poVar1," won this battle! Congratulations!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_30);
  Keyboard::getch();
  return;
}

Assistant:

void Battle::showStats(Player & player) {
    UI::clearScreen();
    std::cout << player.getName() << " won this battle! Congratulations!" << std::endl;
    Keyboard::getch();
}